

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgst02.c
# Opt level: O0

int cgst02(trans_t trans,int m,int n,int nrhs,SuperMatrix *A,singlecomplex *x,int ldx,
          singlecomplex *b,int ldb,float *resid)

{
  float fVar1;
  real rVar2;
  float local_78;
  char local_71;
  float local_70;
  real rStack_6c;
  char transc [1];
  float eps;
  float xnorm;
  float bnorm;
  float anorm;
  int n2;
  int n1;
  int j;
  float d__2;
  float d__1;
  int c__1;
  singlecomplex beta;
  singlecomplex alpha;
  singlecomplex *x_local;
  SuperMatrix *A_local;
  int nrhs_local;
  int n_local;
  int m_local;
  trans_t trans_local;
  
  beta.r = -1.0;
  beta.i = 0.0;
  d__1 = 1.0;
  c__1 = 0;
  d__2 = 1.4013e-45;
  if (((m < 1) || (n < 1)) || (nrhs == 0)) {
    *resid = 0.0;
  }
  else {
    if ((trans == TRANS) || (trans == CONJ)) {
      local_71 = 'T';
      bnorm = (float)m;
      anorm = (float)n;
    }
    else {
      local_71 = 'N';
      bnorm = (float)n;
      anorm = (float)m;
    }
    local_70 = smach("Epsilon");
    fVar1 = clangs("1",A);
    if (0.0 < fVar1) {
      sp_cgemm(&local_71,"N",(int)anorm,nrhs,(int)bnorm,beta,A,x,ldx,_d__1,b,ldb);
      *resid = 0.0;
      for (n2 = 0; n2 < nrhs; n2 = n2 + 1) {
        rVar2 = scasum_((integer *)&anorm,b + n2 * ldb,(integer *)&d__2);
        rStack_6c = scasum_((integer *)&bnorm,x + n2 * ldx,(integer *)&d__2);
        if (0.0 < rStack_6c) {
          j = (int)*resid;
          n1 = (int)(((rVar2 / fVar1) / rStack_6c) / local_70);
          local_78 = (float)n1;
          if ((float)n1 < (float)j) {
            local_78 = (float)j;
          }
          *resid = local_78;
        }
        else {
          *resid = 1.0 / local_70;
        }
      }
    }
    else {
      *resid = 1.0 / local_70;
    }
  }
  return 0;
}

Assistant:

int cgst02(trans_t trans, int m, int n, int nrhs, SuperMatrix *A,
           singlecomplex *x, int ldx, singlecomplex *b, int ldb, float *resid)
{
    /* Table of constant values */
    singlecomplex alpha = {-1., 0.0};
    singlecomplex beta  = {1., 0.0};
    int    c__1  = 1;
    
    /* System generated locals */
    float d__1, d__2;

    /* Local variables */
    int j;
    int n1, n2;
    float anorm, bnorm;
    float xnorm;
    float eps;
    char transc[1];

    /* Function prototypes */
    extern float clangs(char *, SuperMatrix *);
    extern float scasum_(int *, singlecomplex *, int *);
    
    /* Function Body */
    if ( m <= 0 || n <= 0 || nrhs == 0) {
	*resid = 0.;
	return 0;
    }

    if ( (trans == TRANS) || (trans == CONJ) ) {
	n1 = n;
	n2 = m;
        *transc = 'T';
    } else {
	n1 = m;
	n2 = n;
	*transc = 'N';
    }

    /* Exit with RESID = 1/EPS if ANORM = 0. */
    eps = smach("Epsilon");
    anorm = clangs("1", A);
    if (anorm <= 0.) {
	*resid = 1. / eps;
	return 0;
    }

    /* Compute  B - A*X  (or  B - A'*X ) and store in B. */

    sp_cgemm(transc, "N", n1, nrhs, n2, alpha, A, x, ldx, beta, b, ldb);

    /* Compute the maximum over the number of right hand sides of   
       norm(B - A*X) / ( norm(A) * norm(X) * EPS ) . */

    *resid = 0.;
    for (j = 0; j < nrhs; ++j) {
	bnorm = scasum_(&n1, &b[j*ldb], &c__1);
	xnorm = scasum_(&n2, &x[j*ldx], &c__1);
	if (xnorm <= 0.) {
	    *resid = 1. / eps;
	} else {
	    /* Computing MAX */
	    d__1 = *resid, d__2 = bnorm / anorm / xnorm / eps;
	    *resid = SUPERLU_MAX(d__1, d__2);
	}
    }

    return 0;

}